

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mismatch_suite.cpp
# Opt level: O0

void test_u16string(void)

{
  bool v;
  size_type sVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_fd8;
  basic_variable<std::allocator<char>_> *local_fb8;
  undefined4 local_f5c;
  iterator local_f58;
  iterator local_f40;
  difference_type local_f28 [2];
  iterator local_f18;
  iterator local_f00;
  iterator local_ee8;
  undefined1 local_ed0 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range_9;
  int local_e98;
  bool local_e91;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_e90;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_e88;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_e28;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_dc8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_d68;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_d08;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_ca8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_c48;
  undefined1 local_be8 [24];
  variable second_9;
  variable first_9;
  undefined4 local_b6c;
  iterator local_b68;
  iterator local_b50;
  difference_type local_b38 [2];
  iterator local_b28;
  iterator local_b10;
  iterator local_af8;
  undefined1 local_ae0 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range_8;
  basic_variable<std::allocator<char>_> local_aa8;
  basic_variable<std::allocator<char>_> local_a78;
  basic_variable<std::allocator<char>_> local_a48;
  basic_variable<std::allocator<char>_> local_a18;
  basic_variable<std::allocator<char>_> local_9e8;
  basic_variable<std::allocator<char>_> local_9b8;
  basic_variable<std::allocator<char>_> local_988;
  undefined1 local_958 [24];
  variable second_8;
  variable first_8;
  iterator local_8e0;
  iterator local_8c8;
  difference_type local_8b0 [2];
  iterator local_8a0;
  iterator local_888;
  iterator local_870;
  undefined1 local_858 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range_7;
  variable second_7;
  variable first_7;
  iterator local_7c0;
  iterator local_7a8;
  difference_type local_790 [2];
  iterator local_780;
  iterator local_768;
  iterator local_750;
  undefined1 local_738 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range_6;
  variable second_6;
  variable first_6;
  iterator local_690;
  iterator local_678;
  iterator local_660;
  undefined1 local_648 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range_5;
  variable second_5;
  variable first_5;
  iterator local_5b0;
  iterator local_598;
  difference_type local_580 [2];
  iterator local_570;
  iterator local_558;
  iterator local_540;
  undefined1 local_528 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range_4;
  variable second_4;
  variable first_4;
  iterator local_490;
  iterator local_478;
  difference_type local_460 [2];
  iterator local_450;
  iterator local_438;
  iterator local_420;
  undefined1 local_408 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range_3;
  variable second_3;
  variable first_3;
  iterator local_370;
  iterator local_358;
  difference_type local_340 [2];
  iterator local_330;
  iterator local_318;
  iterator local_300;
  undefined1 local_2e8 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range_2;
  variable second_2;
  variable first_2;
  iterator local_250;
  iterator local_238;
  difference_type local_220 [2];
  iterator local_210;
  iterator local_1f8;
  iterator local_1e0;
  undefined1 local_1c8 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range_1;
  variable second_1;
  variable first_1;
  iterator local_130;
  iterator local_118;
  difference_type local_100 [2];
  iterator local_f0;
  iterator local_d8;
  iterator local_c0;
  undefined1 local_a8 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range;
  undefined1 local_68 [8];
  variable second;
  variable first;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&second.storage.field_0x28,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_68,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_c0,(basic_variable<std::allocator<char>_> *)&second.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_d8,(basic_variable<std::allocator<char>_> *)&second.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_f0,(basic_variable<std::allocator<char>_> *)local_68);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_a8,&local_c0,&local_d8,&local_f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_118,(basic_variable<std::allocator<char>_> *)&second.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_130,(iterator *)local_a8);
  local_100[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_118,&local_130);
  first_1.storage._44_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x21e,"void test_u16string()",local_100,&first_1.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_130);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_118);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&second.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_1.storage.field_0x28,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             &range_1.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1e0,(basic_variable<std::allocator<char>_> *)&second_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1f8,(basic_variable<std::allocator<char>_> *)&second_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_210,
             (basic_variable<std::allocator<char>_> *)
             &range_1.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_1c8,&local_1e0,&local_1f8,&local_210);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_210);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_238,(basic_variable<std::allocator<char>_> *)&second_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_250,(iterator *)local_1c8);
  local_220[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_238,&local_250);
  first_2.storage._44_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x225,"void test_u16string()",local_220,&first_2.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_250);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_238);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &range_1.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_2.storage.field_0x28,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)
             &range_2.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_300,(basic_variable<std::allocator<char>_> *)&second_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_318,(basic_variable<std::allocator<char>_> *)&second_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_330,
             (basic_variable<std::allocator<char>_> *)
             &range_2.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_2e8,&local_300,&local_318,&local_330);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_330);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_358,(basic_variable<std::allocator<char>_> *)&second_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_370,(iterator *)local_2e8);
  local_340[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_358,&local_370);
  first_3.storage._44_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x22c,"void test_u16string()",local_340,&first_3.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_358);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &range_2.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_3.storage.field_0x28,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &range_3.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_420,(basic_variable<std::allocator<char>_> *)&second_3.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_438,(basic_variable<std::allocator<char>_> *)&second_3.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_450,
             (basic_variable<std::allocator<char>_> *)
             &range_3.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_408,&local_420,&local_438,&local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_420);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_478,(basic_variable<std::allocator<char>_> *)&second_3.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_490,(iterator *)local_408);
  local_460[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_478,&local_490);
  first_4.storage._44_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x233,"void test_u16string()",local_460,&first_4.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_490);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_478);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_408);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &range_3.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_3.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_4.storage.field_0x28,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &range_4.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_540,(basic_variable<std::allocator<char>_> *)&second_4.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_558,(basic_variable<std::allocator<char>_> *)&second_4.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_570,
             (basic_variable<std::allocator<char>_> *)
             &range_4.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_528,&local_540,&local_558,&local_570);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_570);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_540);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_598,(basic_variable<std::allocator<char>_> *)&second_4.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_5b0,(iterator *)local_528);
  local_580[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_598,&local_5b0);
  first_5.storage._44_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x23a,"void test_u16string()",local_580,&first_5.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_598);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_528);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &range_4.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_4.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_5.storage.field_0x28,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &range_5.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_660,(basic_variable<std::allocator<char>_> *)&second_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_678,(basic_variable<std::allocator<char>_> *)&second_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_690,
             (basic_variable<std::allocator<char>_> *)
             &range_5.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_648,&local_660,&local_678,&local_690);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_690);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_678);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_660);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&first_6.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)&second_5.storage.field_0x28);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                ((iterator *)local_648,(iterator *)&first_6.storage.field_0x28);
  boost::detail::test_impl
            ("range.first == first.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x241,"void test_u16string()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&first_6.storage.field_0x28);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_648);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &range_5.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_6.storage.field_0x28,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &range_6.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_750,(basic_variable<std::allocator<char>_> *)&second_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_768,(basic_variable<std::allocator<char>_> *)&second_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_780,
             (basic_variable<std::allocator<char>_> *)
             &range_6.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_738,&local_750,&local_768,&local_780);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_780);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_768);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_750);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_7a8,(basic_variable<std::allocator<char>_> *)&second_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_7c0,(iterator *)local_738);
  local_790[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_7a8,&local_7c0);
  first_7.storage._44_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x247,"void test_u16string()",local_790,&first_7.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7a8);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_738);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &range_6.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_7.storage.field_0x28,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &range_7.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_870,(basic_variable<std::allocator<char>_> *)&second_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_888,(basic_variable<std::allocator<char>_> *)&second_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8a0,
             (basic_variable<std::allocator<char>_> *)
             &range_7.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_858,&local_870,&local_888,&local_8a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_888);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_870);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8c8,(basic_variable<std::allocator<char>_> *)&second_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_8e0,(iterator *)local_858);
  local_8b0[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_8c8,&local_8e0);
  first_8.storage._44_4_ = 0;
  sVar1 = 0x24e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x24e,"void test_u16string()",local_8b0,&first_8.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8c8);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &range_7.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_8.storage.field_0x28,L"charlie");
  range_8.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_aa8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             range_8.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,true);
  range_8.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_a78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             range_8.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,2);
  range_8.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_a48;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)
             range_8.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,3.0);
  range_8.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_a18;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             range_8.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,"alpha");
  range_8.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_9e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             range_8.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"bravo");
  range_8.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_9b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             range_8.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"charlie");
  range_8.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_988;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             range_8.second.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"delta");
  local_958._0_8_ = &local_aa8;
  local_958._8_8_ = 7;
  init._M_len = sVar1;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_958 + 0x10),
             (basic_array<std::allocator<char>_> *)local_958._0_8_,init);
  local_fb8 = (basic_variable<std::allocator<char>_> *)local_958;
  do {
    local_fb8 = local_fb8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_fb8);
  } while (local_fb8 != &local_aa8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_af8,(basic_variable<std::allocator<char>_> *)&second_8.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_b10,(basic_variable<std::allocator<char>_> *)&second_8.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b28,(basic_variable<std::allocator<char>_> *)(local_958 + 0x10));
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_ae0,&local_af8,&local_b10,&local_b28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b10);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_af8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b50,(basic_variable<std::allocator<char>_> *)&second_8.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_b68,(iterator *)local_ae0);
  local_b38[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_b50,&local_b68);
  local_b6c = 0;
  sVar1 = 0x255;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x255,"void test_u16string()",local_b38,&local_b6c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b68);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b50);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_ae0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_958 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_8.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_9.storage.field_0x28,L"charlie");
  local_e90 = &local_e88;
  local_e91 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_e90,(char (*) [6])"alpha",&local_e91);
  local_e90 = &local_e28;
  local_e98 = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_e90,(char (*) [6])"bravo",&local_e98);
  local_e90 = &local_dc8;
  range_9.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current.current = '\0';
  range_9.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._9_7_ = 0x40080000000000;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_double,_true>
            (local_e90,(char (*) [8])"charlie",
             (double *)
             &range_9.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_e90 = &local_d68;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[9],_true>
            (local_e90,(char (*) [6])"delta",(char (*) [9])"hydrogen");
  local_e90 = &local_d08;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_wchar_t_(&)[7],_true>
            (local_e90,(char (*) [5])"echo",(wchar_t (*) [7])L"helium");
  local_e90 = &local_ca8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char16_t_(&)[8],_true>
            (local_e90,(char (*) [8])"foxtrot",(char16_t (*) [8])L"lithium");
  local_e90 = &local_c48;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char32_t_(&)[10],_true>
            (local_e90,(char (*) [5])"golf",(char32_t (*) [10])L"beryllium");
  local_be8._0_8_ = &local_e88;
  local_be8._8_8_ = 7;
  init_00._M_len = sVar1;
  init_00._M_array = (iterator)0x7;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_be8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_be8._0_8_,init_00);
  local_fd8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_be8;
  do {
    local_fd8 = local_fd8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_fd8);
  } while (local_fd8 != &local_e88);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_ee8,(basic_variable<std::allocator<char>_> *)&second_9.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_f00,(basic_variable<std::allocator<char>_> *)&second_9.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_f18,(basic_variable<std::allocator<char>_> *)(local_be8 + 0x10));
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_ed0,&local_ee8,&local_f00,&local_f18);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f18);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f00);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ee8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_f40,(basic_variable<std::allocator<char>_> *)&second_9.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_f58,(iterator *)local_ed0);
  local_f28[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_f40,&local_f58);
  local_f5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x265,"void test_u16string()",local_f28,&local_f5c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f58);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f40);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_ed0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_be8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&second_9.storage.field_0x28);
  return;
}

Assistant:

void test_u16string()
{
    // u16string - boolean
    {
        variable first(u"charlie");
        variable second(true);
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u16string - integer
    {
        variable first(u"charlie");
        variable second(2);
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u16string - real
    {
        variable first(u"charlie");
        variable second(3.0);
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u16string - string
    {
        variable first(u"charlie");
        variable second("alpha");
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u16string - wstring
    {
        variable first(u"charlie");
        variable second(L"bravo");
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u16string - u16string
    {
        variable first(u"charlie");
        variable second(u"charlie");
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST(range.first == first.end());
    }
    {
        variable first(u"charlie");
        variable second(u"zulu");
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u16string - u32string
    {
        variable first(u"charlie");
        variable second(U"delta");
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u16string - array
    {
        variable first(u"charlie");
        variable second = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u16string - map
    {
        variable first(u"charlie");
        variable second = map::make(
        {
            { "alpha", true },
            { "bravo", 2 },
            { "charlie", 3.0 },
            { "delta", "hydrogen" },
            { "echo", L"helium" },
            { "foxtrot", u"lithium" },
            { "golf", U"beryllium" }
        });
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
}